

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

type_id * metacall_type_ids(void **args,size_t size)

{
  metacall_value_id mVar1;
  ulong in_RSI;
  size_t iterator;
  type_id *ids;
  void *in_stack_ffffffffffffffd8;
  ulong local_20;
  type_id *local_18;
  
  local_18 = (type_id *)0x0;
  if (in_RSI != 0) {
    local_18 = (type_id *)malloc(in_RSI << 2);
    for (local_20 = 0; local_20 < in_RSI; local_20 = local_20 + 1) {
      mVar1 = metacall_value_id(in_stack_ffffffffffffffd8);
      local_18[local_20] = mVar1;
    }
  }
  return local_18;
}

Assistant:

type_id *metacall_type_ids(void *args[], size_t size)
{
	type_id *ids = NULL;

	if (size > 0)
	{
		ids = (type_id *)malloc(sizeof(type_id) * size);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			ids[iterator] = metacall_value_id(args[iterator]);
		}
	}

	return ids;
}